

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O0

void convertMe(void)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  Partner *pSecond;
  Partner *pFirst;
  
  pvVar2 = operator_new(1);
  bVar1 = process();
  if (bVar1) {
    pvVar3 = operator_new(1);
    bVar1 = processSecond();
    if (bVar1) {
      process();
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,1);
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,1);
      }
    }
    else {
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,1);
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,1);
      }
    }
  }
  else if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,1);
  }
  return;
}

Assistant:

void convertMe()
{
    Partner* pFirst = new Partner();

    if (!process())
    {
        delete pFirst;
        return;
    }

    Partner* pSecond = new Partner();

    if (!processSecond())
    {
        delete pFirst;
        delete pSecond;
        return;
    }

    process();
    delete pFirst;
    delete pSecond;
}